

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mir-gen.c
# Opt level: O0

void calculate_dominators(gen_ctx_t gen_ctx)

{
  bb_t_conflict elem;
  bb_t_conflict local_20;
  bb_t_conflict bb;
  bb_t_conflict entry_bb;
  gen_ctx_t gen_ctx_local;
  
  elem = DLIST_bb_t_head(&gen_ctx->curr_cfg->bbs);
  bitmap_clear(elem->dom_out);
  for (local_20 = DLIST_bb_t_next(elem); local_20 != (bb_t_conflict)0x0;
      local_20 = DLIST_bb_t_next(local_20)) {
    bitmap_set_bit_range_p(local_20->dom_out,0,(ulong)gen_ctx->curr_bb_index);
  }
  solve_dataflow(gen_ctx,1,dom_con_func_0,dom_con_func_n,dom_trans_func);
  return;
}

Assistant:

static void calculate_dominators (gen_ctx_t gen_ctx) {
  bb_t entry_bb = DLIST_HEAD (bb_t, curr_cfg->bbs);

  bitmap_clear (entry_bb->dom_out);
  for (bb_t bb = DLIST_NEXT (bb_t, entry_bb); bb != NULL; bb = DLIST_NEXT (bb_t, bb))
    bitmap_set_bit_range_p (bb->dom_out, 0, curr_bb_index);
  solve_dataflow (gen_ctx, TRUE, dom_con_func_0, dom_con_func_n, dom_trans_func);
}